

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.cpp
# Opt level: O1

string * __thiscall
arguments_t::operator[](string *__return_storage_ptr__,arguments_t *this,string *key)

{
  pointer pcVar1;
  mapped_type *pmVar2;
  
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&this->options,key);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pmVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pmVar2->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string arguments_t::operator[](std::string const & key) const {
    return this->options.at(key);
}